

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O3

void __thiscall
PathTracerViewer::create_descriptors(PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  element_type *peVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  VkSampler immutable_samplers [1];
  allocator_type local_79;
  undefined1 local_78 [40];
  element_type *peStack_50;
  undefined1 local_40 [8];
  _func_int **local_38;
  element_type *peStack_30;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  local_78._32_8_ = (element_type *)0x100000001;
  __l._M_len = 1;
  __l._M_array = (iterator)(local_78 + 0x20);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_78,__l,
             (allocator_type *)local_40);
  myvk::DescriptorPool::Create
            ((DescriptorPool *)&local_38,device,1,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_78);
  peVar6 = peStack_30;
  pp_Var5 = local_38;
  local_38 = (_func_int **)0x0;
  peStack_30 = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_pool).
           super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var5;
  (this->m_descriptor_pool).super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar6;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (peStack_30 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_30);
    }
  }
  if ((element_type *)local_78._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  local_40 = (undefined1  [8])
             ((this->m_sampler).super___shared_ptr<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             )->m_sampler;
  local_38 = (_func_int **)0x100000000;
  peStack_30 = (element_type *)0x1000000001;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_38;
  local_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_78,__l_00,&local_79);
  myvk::DescriptorSetLayout::Create
            ((DescriptorSetLayout *)(local_78 + 0x20),device,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             local_78);
  peVar4 = peStack_50;
  uVar2 = local_78._32_8_;
  local_78._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peStack_50 = (element_type *)0x0;
  p_Var1 = (this->m_descriptor_set_layout).
           super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar2;
  (this->m_descriptor_set_layout).
  super___shared_ptr<myvk::DescriptorSetLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar4;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if (peStack_50 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_50);
    }
  }
  if ((element_type *)local_78._0_8_ != (element_type *)0x0) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ - local_78._0_8_);
  }
  myvk::DescriptorSet::Create
            ((DescriptorSet *)local_78,&this->m_descriptor_pool,&this->m_descriptor_set_layout);
  uVar3 = local_78._8_8_;
  uVar2 = local_78._0_8_;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_8_ = (pointer)0x0;
  p_Var1 = (this->m_descriptor_set).
           super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar2;
  (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    if ((pointer)local_78._8_8_ != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
  }
  return;
}

Assistant:

void PathTracerViewer::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1}});
	{
		VkDescriptorSetLayoutBinding binding = {};
		binding.binding = 0;
		binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		binding.descriptorCount = 1;
		binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};
		binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {binding});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}